

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.c
# Opt level: O3

void MD5Update(MD5Context *ctx,uchar *buf,uint len)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  uint uVar8;
  size_t __n;
  uchar *__dest;
  
  uVar8 = ctx->bits[0];
  ctx->bits[0] = len * 8 + uVar8;
  ctx->bits[1] = ctx->bits[1] + (len >> 0x1d) + (uint)CARRY4(len * 8,uVar8);
  uVar8 = uVar8 >> 3 & 0x3f;
  if (uVar8 != 0) {
    __dest = ctx->in + uVar8;
    uVar8 = 0x40 - uVar8;
    if (len < uVar8) {
      __n = (size_t)len;
      goto LAB_001013b8;
    }
    memcpy(__dest,buf,(ulong)uVar8);
    MD5Transform(ctx->buf,(uint32 *)ctx->in);
    buf = buf + uVar8;
    len = len - uVar8;
  }
  if (0x3f < len) {
    do {
      uVar1 = *(undefined8 *)buf;
      uVar2 = *(undefined8 *)(buf + 8);
      uVar3 = *(undefined8 *)(buf + 0x10);
      uVar4 = *(undefined8 *)(buf + 0x18);
      uVar5 = *(undefined8 *)(buf + 0x20);
      uVar6 = *(undefined8 *)(buf + 0x28);
      uVar7 = *(undefined8 *)(buf + 0x38);
      *(undefined8 *)(ctx->in + 0x30) = *(undefined8 *)(buf + 0x30);
      *(undefined8 *)(ctx->in + 0x38) = uVar7;
      *(undefined8 *)(ctx->in + 0x20) = uVar5;
      *(undefined8 *)(ctx->in + 0x28) = uVar6;
      *(undefined8 *)(ctx->in + 0x10) = uVar3;
      *(undefined8 *)(ctx->in + 0x18) = uVar4;
      *(undefined8 *)ctx->in = uVar1;
      *(undefined8 *)(ctx->in + 8) = uVar2;
      MD5Transform(ctx->buf,(uint32 *)ctx->in);
      buf = buf + 0x40;
      len = len - 0x40;
    } while (0x3f < len);
  }
  __dest = ctx->in;
  __n = (size_t)len;
LAB_001013b8:
  memcpy(__dest,buf,__n);
  return;
}

Assistant:

void MD5Update(struct MD5Context *ctx, unsigned char *buf, unsigned int len)
{
  uint32 t;

  /* Update bitcount */

  t = ctx->bits[0];
  if ((ctx->bits[0] = t + ((uint32)len << 3)) < t)
    ctx->bits[1]++;             /* Carry from low to high */
  ctx->bits[1] += len >> 29;

  t = (t >> 3) & 0x3f;          /* Bytes already in shsInfo->data */

  /* Handle any leading odd-sized chunks */

  if (t) {
    unsigned char *p = (unsigned char *)ctx->in + t;

    t = 64 - t;
    if (len < t) {
      memcpy(p, buf, len);
      return;
    }
    memcpy(p, buf, t);
    byteReverse(ctx->in, 16);
    MD5Transform(ctx->buf, (uint32 *)ctx->in);
    buf += t;
    len -= t;
  }
  /* Process data in 64-byte chunks */

  while (len >= 64) {
    memcpy(ctx->in, buf, 64);
    byteReverse(ctx->in, 16);
    MD5Transform(ctx->buf, (uint32 *)ctx->in);
    buf += 64;
    len -= 64;
  }

  /* Handle any remaining bytes of data. */

  memcpy(ctx->in, buf, len);
}